

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  
  uVar4 = a->c;
  iVar17 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar14 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar14 = 0;
    uVar23 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar23 = 0;
    }
    for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
      lVar16 = a->elemsize * a->cstep * uVar15;
      pvVar5 = a->data;
      lVar18 = b->elemsize * b->cstep * uVar15;
      pvVar6 = b->data;
      lVar19 = c->elemsize * c->cstep * uVar15;
      pvVar7 = c->data;
      lVar20 = 0;
      lVar21 = 0;
      for (iVar22 = 0; iVar22 + 3 < iVar17; iVar22 = iVar22 + 4) {
        pfVar1 = (float *)((long)pvVar6 + lVar21 + lVar18);
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar2 = (float *)((long)pvVar5 + lVar21 + lVar16);
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = (float *)((long)pvVar7 + lVar21 + lVar19);
        *pfVar3 = *pfVar1 * *pfVar2;
        pfVar3[1] = fVar8 * fVar11;
        pfVar3[2] = fVar9 * fVar12;
        pfVar3[3] = fVar10 * fVar13;
        lVar21 = lVar21 + 0x10;
        lVar20 = lVar20 + 4;
      }
      for (; (int)lVar20 < iVar17; lVar20 = lVar20 + 1) {
        *(float *)((long)pvVar7 + lVar20 * 4 + lVar19) =
             *(float *)((long)pvVar6 + lVar20 * 4 + lVar18) *
             *(float *)((long)pvVar5 + lVar20 * 4 + lVar16);
      }
    }
  }
  return iVar14;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}